

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void serialization_pipeline<TreesIndexer,char*>(TreesIndexer *model,char **out)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t sVar4;
  SignalSwitcher ss;
  SignalSwitcher SStack_38;
  
  SignalSwitcher::SignalSwitcher(&SStack_38);
  pcVar1 = *out;
  add_setup_info<char*>(out,false);
  **out = '\x05';
  pcVar2 = *out;
  *out = pcVar2 + 1;
  sVar4 = get_size_model(model);
  *(size_t *)(pcVar2 + 1) = sVar4;
  *out = *out + 8;
  serialize_model<char*>(model,out);
  check_interrupt_switch(&SStack_38);
  **out = '\0';
  pcVar2 = *out;
  *out = pcVar2 + 1;
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2 = *out;
  *out = pcVar1;
  uVar3 = *(undefined8 *)watermark;
  *(undefined8 *)(pcVar1 + 5) = *(undefined8 *)(watermark + 5);
  *(undefined8 *)pcVar1 = uVar3;
  *out = pcVar2 + 8;
  SignalSwitcher::~SignalSwitcher(&SStack_38);
  return;
}

Assistant:

void serialization_pipeline(const Model &model, otype &out)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);
    
    add_setup_info(out, false);
    uint8_t model_type = get_model_code(model);
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);
    size_t size_model = get_size_model(model);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);
    serialize_model(model, out);
    check_interrupt_switch(ss);

    /* This last bit will be left open in order to signal if anything follows,
       in case it's decided to change the format in the future or to add
       something additional, along with a 'size_t' slot in case it would need
       to jump ahead or something like that. */
    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}